

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonBondedInteractionsSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionsSectionParser
          (NonBondedInteractionsSectionParser *this,ForceFieldOptions *options)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  allocator<char> local_39;
  key_type local_38;
  
  (this->super_SectionParser).sectionName_._M_dataplus._M_p =
       (pointer)&(this->super_SectionParser).sectionName_.field_2;
  (this->super_SectionParser).sectionName_._M_string_length = 0;
  (this->super_SectionParser).sectionName_.field_2._M_local_buf[0] = '\0';
  (this->super_SectionParser)._vptr_SectionParser =
       (_func_int **)&PTR__NonBondedInteractionsSectionParser_0021bde8;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this_00 = &this->stringToEnumMap_;
  p_Var1 = &(this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->options_ = options;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"NonBondedInteractions",&local_39);
  std::__cxx11::string::_M_assign((string *)&(this->super_SectionParser).sectionName_);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"MAW",&local_39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[](this_00,&local_38);
  *pmVar2 = MAW;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"ShiftedMorse",&local_39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[](this_00,&local_38);
  *pmVar2 = ShiftedMorse;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"LennardJones",&local_39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[](this_00,&local_38);
  *pmVar2 = LennardJones;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"RepulsiveMorse",&local_39)
  ;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[](this_00,&local_38);
  *pmVar2 = RepulsiveMorse;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"RepulsivePower",&local_39)
  ;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[](this_00,&local_38);
  *pmVar2 = RepulsivePower;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Mie",&local_39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[](this_00,&local_38);
  *pmVar2 = Mie;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Buckingham",&local_39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[](this_00,&local_38);
  *pmVar2 = Buckingham;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"EAMTable",&local_39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[](this_00,&local_38);
  *pmVar2 = EAMTable;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"EAMZhou",&local_39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[](this_00,&local_38);
  *pmVar2 = EAMZhou;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"EAMOxides",&local_39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[](this_00,&local_38);
  *pmVar2 = EAMOxides;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"InversePowerSeries",&local_39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[](this_00,&local_38);
  *pmVar2 = InversePowerSeries;
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

NonBondedInteractionsSectionParser::NonBondedInteractionsSectionParser(
      ForceFieldOptions& options) :
      options_(options) {
    setSectionName("NonBondedInteractions");

    stringToEnumMap_["MAW"]                = MAW;
    stringToEnumMap_["ShiftedMorse"]       = ShiftedMorse;
    stringToEnumMap_["LennardJones"]       = LennardJones;
    stringToEnumMap_["RepulsiveMorse"]     = RepulsiveMorse;
    stringToEnumMap_["RepulsivePower"]     = RepulsivePower;
    stringToEnumMap_["Mie"]                = Mie;
    stringToEnumMap_["Buckingham"]         = Buckingham;
    stringToEnumMap_["EAMTable"]           = EAMTable;
    stringToEnumMap_["EAMZhou"]            = EAMZhou;
    stringToEnumMap_["EAMOxides"]          = EAMOxides;
    stringToEnumMap_["InversePowerSeries"] = InversePowerSeries;
  }